

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O1

MultiIndexSet * __thiscall
TasGrid::GridGlobal::selectTensors
          (MultiIndexSet *__return_storage_ptr__,GridGlobal *this,size_t dims,int depth,
          TypeDepth type,vector<int,_std::allocator<int>_> *anisotropic_weights,TypeOneDRule crule,
          vector<int,_std::allocator<int>_> *level_limits)

{
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((type < type_iptensor) && ((0x40eU >> (type & 0x1f) & 1) != 0)) {
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_10 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:82:74)>
               ::_M_invoke;
    local_18 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:82:74)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)&local_28,
               (vector<int,_std::allocator<int>_> *)anisotropic_weights,
               (vector<int,_std::allocator<int>_> *)level_limits);
    if (local_18 != (code *)0x0) {
      (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
    }
  }
  else if (crule == rule_customtabulated) {
    if ((type < (type_qptensor|type_level)) && ((0x12a0U >> (type & 0x1f) & 1) != 0)) {
      local_48._8_8_ = 0;
      pcStack_30 = ::std::
                   _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:87:82)>
                   ::_M_invoke;
      local_38 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:87:82)>
                 ::_M_manager;
      local_48._M_unused._M_object = this;
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)&local_48,
                 (vector<int,_std::allocator<int>_> *)anisotropic_weights,
                 (vector<int,_std::allocator<int>_> *)level_limits);
      if (local_38 != (code *)0x0) {
        (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
      }
    }
    else {
      local_68._8_8_ = 0;
      pcStack_50 = ::std::
                   _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:90:82)>
                   ::_M_invoke;
      local_58 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:90:82)>
                 ::_M_manager;
      local_68._M_unused._M_object = this;
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)&local_68,
                 (vector<int,_std::allocator<int>_> *)anisotropic_weights,
                 (vector<int,_std::allocator<int>_> *)level_limits);
      if (local_58 != (code *)0x0) {
        (*local_58)((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
      }
    }
  }
  else if ((type < (type_qptensor|type_level)) && ((0x12a0U >> (type & 0x1f) & 1) != 0)) {
    local_88._8_8_ = 0;
    local_88._M_unused._M_object = &crule;
    pcStack_70 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:95:82)>
                 ::_M_invoke;
    local_78 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:95:82)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)&local_88,
               (vector<int,_std::allocator<int>_> *)anisotropic_weights,
               (vector<int,_std::allocator<int>_> *)level_limits);
    if (local_78 != (code *)0x0) {
      (*local_78)((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
    }
  }
  else {
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = &crule;
    pcStack_90 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:98:82)>
                 ::_M_invoke;
    local_98 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:98:82)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,dims,depth,type,(function<int_(int)> *)&local_a8,
               (vector<int,_std::allocator<int>_> *)anisotropic_weights,
               (vector<int,_std::allocator<int>_> *)level_limits);
    if (local_98 != (code *)0x0) {
      (*local_98)((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridGlobal::selectTensors(size_t dims, int depth, TypeDepth type, const std::vector<int> &anisotropic_weights,
                                        TypeOneDRule crule, std::vector<int> const &level_limits) const{
    if (OneDimensionalMeta::isExactLevel(type)){ // no need to know exactness
        return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return l; },
                                                      anisotropic_weights, level_limits);
    }else{ // work with exactness specific to the rule
        if (crule == rule_customtabulated){
            if (OneDimensionalMeta::isExactQuadrature(type)){
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return custom.getQExact(l); },
                                                              anisotropic_weights, level_limits);
            }else{
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return custom.getIExact(l); },
                                                              anisotropic_weights, level_limits);
            }
        }else{ // using regular OneDimensionalMeta
            if (OneDimensionalMeta::isExactQuadrature(type)){
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return OneDimensionalMeta::getQExact(l, crule); },
                                                              anisotropic_weights, level_limits);
            }else{
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return OneDimensionalMeta::getIExact(l, crule); },
                                                              anisotropic_weights, level_limits);
            }
        }
    }
}